

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerArgIn(Lowerer *this,Instr *instrArgIn)

{
  OpCode OVar1;
  Opnd *pOVar2;
  StackSym *pSVar3;
  Opnd *pOVar4;
  Type pJVar5;
  _func_int **pp_Var6;
  code *pcVar7;
  bool bVar8;
  OpndKind OVar9;
  BOOLEAN BVar10;
  ArgSlot AVar11;
  ArgSlot AVar12;
  ArgSlot AVar13;
  int iVar14;
  undefined4 *puVar15;
  JITTimeFunctionBody *pJVar16;
  RegOpnd *pRVar17;
  Instr *pIVar18;
  LabelInstr *pLVar19;
  LabelInstr *branchTarget;
  BranchInstr *pBVar20;
  IntConstOpnd *pIVar21;
  undefined4 extraout_var;
  AddrOpnd *src;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  LabelInstr *pLVar22;
  Instr *pIVar23;
  short sVar24;
  Lowerer *this_01;
  ushort uVar25;
  Instr *unaff_R14;
  Opnd *local_78;
  Instr *local_60;
  RegOpnd *local_58;
  ushort local_48;
  Instr *local_38;
  
  if (instrArgIn == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ce3,"(instrArgIn)","instrArgIn");
    if (!bVar8) goto LAB_005ba808;
    *puVar15 = 0;
    unaff_R14 = (Instr *)0x0;
  }
  OVar1 = instrArgIn->m_opcode;
  if (OVar1 == ArgIn_Rest) {
    local_78 = IR::Instr::UnlinkDst(instrArgIn);
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar8 = JITTimeFunctionBody::HasImplicitArgIns(pJVar16);
    pIVar23 = instrArgIn;
    if ((bVar8) && (this->m_func->argInsCount != 0)) {
      if (instrArgIn->m_opcode == ArgIn_A) {
        local_60 = (Instr *)0x0;
      }
      else {
        local_60 = (Instr *)0x0;
        do {
          pIVar23 = pIVar23->m_prev;
          if (local_60 == (Instr *)0x0) {
            local_60 = pIVar23;
          }
        } while (pIVar23->m_opcode != ArgIn_A);
      }
      local_58 = (RegOpnd *)0x0;
      bVar8 = true;
    }
    else {
      if (instrArgIn->m_func != this->m_func) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2cf9,"(instrArgIn->m_func == this->m_func)",
                           "instrArgIn->m_func == this->m_func");
        if (!bVar8) goto LAB_005ba808;
        *puVar15 = 0;
      }
      AVar11 = Func::GetInParamsCount(this->m_func);
      local_58 = (RegOpnd *)0x0;
      pIVar18 = LowererMD::LoadInputParamCount(&this->m_lowererMD,instrArgIn,-(uint)AVar11,false);
      pOVar2 = pIVar18->m_dst;
      pLVar19 = IR::LabelInstr::New(Label,this->m_func,false);
      this_01 = (Lowerer *)0x0;
      pIVar21 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertCompareBranch(this_01,pOVar2,&pIVar21->super_Opnd,BrGe_A,false,pLVar19,instrArgIn,false)
      ;
      pIVar21 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove(pOVar2,&pIVar21->super_Opnd,instrArgIn,true);
      IR::Instr::InsertBefore(instrArgIn,&pLVar19->super_Instr);
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar8 = JITTimeFunctionBody::IsCoroutine(pJVar16);
      if (bVar8) {
        bVar8 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
        if (bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d0a,"(!m_func->IsLoopBody())",
                             "LoopBody Jit should not involve Rest params");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        local_58 = LoadGeneratorArgsPtr(instrArgIn);
      }
      AVar11 = Func::GetInParamsCount(this->m_func);
      bVar8 = false;
      pIVar21 = IR::IntConstOpnd::New((ulong)AVar11,TyUint32,this->m_func,false);
      unaff_R14 = LowerRestParameter(this,&pIVar21->super_Opnd,local_78,pOVar2,instrArgIn,local_58);
      local_60 = (Instr *)0x0;
    }
    IR::Instr::Remove(instrArgIn);
    instrArgIn = pIVar23;
    if (!bVar8) {
      return unaff_R14;
    }
  }
  else {
    local_78 = (Opnd *)0x0;
    local_58 = (RegOpnd *)0x0;
    local_60 = (Instr *)0x0;
  }
  pOVar2 = instrArgIn->m_src1;
  OVar9 = IR::Opnd::GetKind(pOVar2);
  if (OVar9 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar8) goto LAB_005ba808;
    *puVar15 = 0;
  }
  pSVar3 = (StackSym *)pOVar2[1]._vptr_Opnd;
  if ((pSVar3->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar8) goto LAB_005ba808;
    *puVar15 = 0;
  }
  local_48 = StackSym::GetParamSlotNum(pSVar3);
  if (local_48 == 1) {
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar8 = JITTimeFunctionBody::IsCoroutine(pJVar16);
    if ((bVar8) && (bVar8 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem), !bVar8)) {
      pRVar17 = LoadGeneratorArgsPtr(instrArgIn);
      ConvertArgOpndIfGeneratorFunction(this,instrArgIn,pRVar17);
    }
    LowererMD::ChangeToAssign(instrArgIn);
    if (local_60 == (Instr *)0x0) {
      local_60 = instrArgIn->m_prev;
    }
  }
  else {
    AVar11 = Func::GetInParamsCount(this->m_func);
    if (AVar11 < local_48) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d28,"(argIndex <= formalsCount)",
                         "Expect to see the ArgIn\'s within the range of the formals");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    if (this->m_func->argInsCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d30,"(this->m_func->argInsCount > 0)","this->m_func->argInsCount > 0");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    pIVar23 = instrArgIn;
    if (this->m_func->argInsCount < 2) {
      uVar25 = 0;
    }
    else {
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar25 = 0;
      do {
        pIVar23 = pIVar23->m_prev;
        if (pIVar23->m_opcode == ArgIn_A) {
          pOVar2 = pIVar23->m_src1;
          OVar9 = IR::Opnd::GetKind(pOVar2);
          if (OVar9 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar8) goto LAB_005ba808;
            *puVar15 = 0;
          }
          pSVar3 = (StackSym *)pOVar2[1]._vptr_Opnd;
          if ((pSVar3->super_Sym).m_kind != SymKindStack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar8) goto LAB_005ba808;
            *puVar15 = 0;
          }
          AVar12 = StackSym::GetParamSlotNum(pSVar3);
          if (local_48 <= AVar12) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x2d39,"(symParam->GetParamSlotNum() < argIndex)",
                               "ArgIn\'s not in numerical order");
            if (!bVar8) goto LAB_005ba808;
            *puVar15 = 0;
          }
          local_48 = StackSym::GetParamSlotNum(pSVar3);
          uVar25 = uVar25 + 1;
        }
        else if (local_60 == (Instr *)0x0) {
          local_60 = pIVar23;
        }
      } while ((int)(uint)uVar25 < (int)(this->m_func->argInsCount - 1));
    }
    if (pIVar23 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2d49,"(instrInsert)","instrInsert");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    if (local_60 == (Instr *)0x0) {
      local_60 = pIVar23->m_prev;
    }
    pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar8 = JITTimeFunctionBody::IsCoroutine(pJVar16);
    if (bVar8) {
      local_58 = LoadGeneratorArgsPtr(pIVar23);
    }
    pIVar18 = LowererMD::LoadInputParamCount(&this->m_lowererMD,pIVar23,-(uint)AVar11,true);
    pOVar2 = pIVar18->m_dst;
    pLVar19 = IR::LabelInstr::New(Label,this->m_func,true);
    InsertBranch(BrLt_A,false,pLVar19,pIVar23);
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar20 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(pIVar23,&pBVar20->super_Instr);
    IR::Instr::InsertBefore(pIVar23,&pLVar19->super_Instr);
    IR::Instr::InsertBefore(pIVar23,&branchTarget->super_Instr);
    pOVar4 = instrArgIn->m_src1;
    OVar9 = IR::Opnd::GetKind(pOVar4);
    if (OVar9 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
    if ((pSVar3->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    AVar12 = StackSym::GetParamSlotNum(pSVar3);
    AVar13 = Func::GetInParamsCount(this->m_func);
    if (AVar13 != AVar12) {
      sVar24 = AVar12 - AVar13;
      do {
        pIVar21 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
        InsertAdd(true,pOVar2,pOVar2,&pIVar21->super_Opnd,&branchTarget->super_Instr);
        InsertBranch(BrEq_A,false,branchTarget,&branchTarget->super_Instr);
        sVar24 = sVar24 + 1;
      } while (sVar24 != 0);
    }
    iVar14 = (*((branchTarget->super_Instr).m_func)->m_scriptContextInfo->_vptr_ScriptContextInfo[1]
             )();
    src = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar14),AddrOpndKindDynamicVar,
                            (branchTarget->super_Instr).m_func,true,(Var)0x0);
    pRVar17 = IR::RegOpnd::New(TyUint64,this->m_func);
    InsertMove(&pRVar17->super_Opnd,&src->super_Opnd,&branchTarget->super_Instr,true);
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)
              new<Memory::JitArenaAllocator>(0x20,this->m_alloc,0x3f1274);
    pJVar5 = this->m_alloc;
    this_00->head = (Type_conflict)0x0;
    this_00->lastFoundIndex = (Type_conflict)0x0;
    this_00->alloc = pJVar5;
    this_00->lastUsedNodePrevNextField = (Type)this_00;
    pLVar19 = branchTarget;
    local_38 = instrArgIn;
    if (uVar25 != 0) {
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      pLVar22 = branchTarget;
      do {
        pOVar4 = instrArgIn->m_dst;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2d80,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        pp_Var6 = pOVar4[1]._vptr_Opnd;
        if (*(char *)((long)pp_Var6 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        BVar10 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_00,*(BVIndex *)(pp_Var6 + 2));
        InsertMove(pOVar4,&pRVar17->super_Opnd,&branchTarget->super_Instr,true);
        pLVar19 = IR::LabelInstr::New(Label,this->m_func,false);
        IR::Instr::InsertAfter(&pLVar22->super_Instr,&pLVar19->super_Instr);
        pIVar23 = instrArgIn->m_prev;
        IR::Instr::Unlink(instrArgIn);
        pOVar4 = instrArgIn->m_src1;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar3->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        AVar12 = StackSym::GetParamSlotNum(pSVar3);
        if (BVar10 == '\0') {
          ConvertArgOpndIfGeneratorFunction(this,instrArgIn,local_58);
          IR::Instr::InsertBefore(&pLVar19->super_Instr,instrArgIn);
          LowererMD::ChangeToAssign(instrArgIn);
          instrArgIn = pIVar23;
        }
        else {
          IR::Instr::Free(instrArgIn);
          instrArgIn = pIVar23;
        }
        while (instrArgIn->m_opcode != ArgIn_A) {
          instrArgIn = instrArgIn->m_prev;
          if (instrArgIn == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x2daf,"(instrArgIn)","???");
            if (!bVar8) goto LAB_005ba808;
            *puVar15 = 0;
          }
        }
        pOVar4 = instrArgIn->m_src1;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar3->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        AVar13 = StackSym::GetParamSlotNum(pSVar3);
        if (AVar12 == AVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2db6,"(diffSlotsNum > 0)","Argins are not in order?");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        else {
          sVar24 = AVar13 - AVar12;
          do {
            pIVar21 = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
            InsertAdd(true,pOVar2,pOVar2,&pIVar21->super_Opnd,&branchTarget->super_Instr);
            InsertBranch(BrEq_A,false,pLVar19,&branchTarget->super_Instr);
            sVar24 = sVar24 + 1;
          } while (sVar24 != 0);
        }
        pOVar4 = instrArgIn->m_src1;
        OVar9 = IR::Opnd::GetKind(pOVar4);
        if (OVar9 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        pSVar3 = (StackSym *)pOVar4[1]._vptr_Opnd;
        if ((pSVar3->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        AVar12 = StackSym::GetParamSlotNum(pSVar3);
        if (AVar11 < AVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2dc0,
                             "(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount)"
                             ,"Expect all ArgIn\'s to be in numerical order by param slot");
          if (!bVar8) goto LAB_005ba808;
          *puVar15 = 0;
        }
        uVar25 = uVar25 - 1;
        pLVar22 = pLVar19;
        local_38 = instrArgIn;
      } while (uVar25 != 0);
    }
    pOVar4 = local_38->m_dst;
    OVar9 = IR::Opnd::GetKind(pOVar4);
    if (OVar9 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2dc9,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    OVar9 = IR::Opnd::GetKind(pOVar4);
    if (OVar9 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar8) goto LAB_005ba808;
      *puVar15 = 0;
    }
    pp_Var6 = pOVar4[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var6 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar8) {
LAB_005ba808:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar15 = 0;
    }
    BVar10 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_00,*(BVIndex *)(pp_Var6 + 2));
    InsertMove(pOVar4,&pRVar17->super_Opnd,&branchTarget->super_Instr,true);
    if (OVar1 == ArgIn_Rest) {
      pIVar21 = IR::IntConstOpnd::New(0,TyUint8,this->m_func,false);
      InsertMove(pOVar2,&pIVar21->super_Opnd,&branchTarget->super_Instr,true);
    }
    pLVar22 = IR::LabelInstr::New(Label,this->m_func,false);
    pBVar20 = IR::BranchInstr::New(JMP,pLVar22,this->m_func);
    IR::Instr::InsertBefore(&branchTarget->super_Instr,&pBVar20->super_Instr);
    IR::Instr::InsertAfter(&pLVar19->super_Instr,&pLVar22->super_Instr);
    if (OVar1 == ArgIn_Rest) {
      AVar11 = Func::GetInParamsCount(this->m_func);
      pIVar21 = IR::IntConstOpnd::New((ulong)AVar11,TyUint32,this->m_func,false);
      LowerRestParameter(this,&pIVar21->super_Opnd,local_78,pOVar2,&pLVar22->super_Instr,local_58);
    }
    IR::Instr::Unlink(local_38);
    if (BVar10 == '\0') {
      ConvertArgOpndIfGeneratorFunction(this,local_38,local_58);
      IR::Instr::InsertBefore(&pLVar22->super_Instr,local_38);
      LowererMD::ChangeToAssign(local_38);
    }
    else {
      IR::Instr::Free(local_38);
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->m_alloc,this_00);
  }
  return local_60;
}

Assistant:

IR::Instr *
Lowerer::LowerArgIn(IR::Instr *instrArgIn)
{
    IR::LabelInstr *   labelDone;
    IR::LabelInstr *   labelUndef;
    IR::LabelInstr *   labelNormal;
    IR::LabelInstr *   labelInit;
    IR::LabelInstr *   labelInitNext;
    IR::BranchInstr *  instrBranch;
    IR::Instr *        instrArgInNext;
    IR::Instr *        instrInsert;
    IR::Instr *        instrPrev;
    IR::Instr *        instrResume = nullptr;
    IR::Opnd *         dstOpnd;
    IR::Opnd *         srcOpnd;
    IR::Opnd *         opndUndef;
    Js::ArgSlot        argIndex;
    StackSym *         symParam;
    BOOLEAN            isDuplicate;
    IR::RegOpnd *      generatorArgsPtrOpnd = nullptr;

    // We start with:
    // s1 = ArgIn_A param1
    // s2 = ArgIn_A param2
    // ...
    // sn = ArgIn_A paramn
    //
    // We want to end up with:
    //
    // s1 = ArgIn_A param1            -- Note that this is unconditional
    // count = (load from param area)
    //     BrLt_A $start, count, n    -- Forward cbranch to the uncommon case
    //     Br $Ln
    // $start:
    //     sn = assign undef
    //     BrGe_A $Ln-1, count, n-1
    //     sn-1 = assign undef
    // ...
    //     s2 = assign undef
    //     Br $done
    // $Ln:
    //     sn = assign paramn
    // $Ln-1:
    //     sn-1 = assign paramn-1
    // ...
    //     s2 = assign param2
    // $done:

    AnalysisAssert(instrArgIn);

    IR::Opnd *restDst = nullptr;
    bool hasRest = instrArgIn->m_opcode == Js::OpCode::ArgIn_Rest;
    if (hasRest)
    {
        IR::Instr *restInstr = instrArgIn;
        restDst = restInstr->UnlinkDst();
        if (m_func->GetJITFunctionBody()->HasImplicitArgIns() && m_func->argInsCount > 0)
        {
            while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
            {
                instrArgIn = instrArgIn->m_prev;
                if (instrResume == nullptr)
                {
                    instrResume = instrArgIn;
                }
            }
            restInstr->Remove();
        }
        else
        {
            Assert(instrArgIn->m_func == this->m_func);
            IR::Instr * instrCount = m_lowererMD.LoadInputParamCount(instrArgIn, -this->m_func->GetInParamsCount());
            IR::Opnd * excessOpnd = instrCount->GetDst();

            IR::LabelInstr *createRestArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

            // BrGe $createRestArray, excess, 0
            InsertCompareBranch(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), Js::OpCode::BrGe_A, createRestArrayLabel, instrArgIn);

            // MOV excess, 0
            InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), instrArgIn);

            // $createRestArray
            instrArgIn->InsertBefore(createRestArrayLabel);

            if (m_func->GetJITFunctionBody()->IsCoroutine())
            {
                AssertMsg(!m_func->IsLoopBody(), "LoopBody Jit should not involve Rest params");
                generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            }

            IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
            IR::Instr *prev = LowerRestParameter(formalsOpnd, restDst, excessOpnd, instrArgIn, generatorArgsPtrOpnd);
            instrArgIn->Remove();
            return prev;
        }
    }

    srcOpnd = instrArgIn->GetSrc1();
    symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();

    argIndex = symParam->GetParamSlotNum();
    if (argIndex == 1)
    {
        // The "this" argument is not source-dependent and doesn't need to be checked.
        if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
        {
            generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrArgIn);
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        }

        m_lowererMD.ChangeToAssign(instrArgIn);
        return instrResume == nullptr ? instrArgIn->m_prev : instrResume;
    }

    Js::ArgSlot formalsCount = this->m_func->GetInParamsCount();

    AssertMsg(argIndex <= formalsCount, "Expect to see the ArgIn's within the range of the formals");

    // Because there may be instructions between the ArgIn's, such as saves to the frame object,
    // we find the top of the sequence of ArgIn's and insert everything there. This assumes that
    // ArgIn's use param symbols as src's and not the results of previous instructions.

    instrPrev = instrArgIn;
    Js::ArgSlot currArgInCount = 0;
    Assert(this->m_func->argInsCount > 0);

    while (currArgInCount < this->m_func->argInsCount - 1)
    {
        instrPrev = instrPrev->m_prev;
        if (instrPrev->m_opcode == Js::OpCode::ArgIn_A)
        {
            srcOpnd = instrPrev->GetSrc1();
            symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();
            AssertMsg(symParam->GetParamSlotNum() < argIndex, "ArgIn's not in numerical order");
            argIndex = symParam->GetParamSlotNum();
            currArgInCount++;
        }
        else
        {
            // Make sure that this instruction gets lowered.
            if (instrResume == nullptr)
            {
                instrResume = instrPrev;
            }
        }
    }
    // The loading of parameters will be inserted above this instruction.
    instrInsert = instrPrev;

    AnalysisAssert(instrInsert);
    if (instrResume == nullptr)
    {
        // We found no intervening non-ArgIn's, so lowering can resume at the previous instruction.
        instrResume = instrInsert->m_prev;
    }

    // Now insert all the checks and undef-assigns.

    if (m_func->GetJITFunctionBody()->IsCoroutine())
    {
        generatorArgsPtrOpnd = LoadGeneratorArgsPtr(instrInsert);
    }

    // excessOpnd = (load from param area) - formalCounts
    IR::Instr * instrCount = this->m_lowererMD.LoadInputParamCount(instrInsert, -formalsCount, true);
    IR::Opnd * excessOpnd = instrCount->GetDst();

    labelUndef = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, /*helperLabel*/ true);
    Lowerer::InsertBranch(Js::OpCode::BrLt_A, labelUndef, instrInsert);

    //     Br $Ln

    labelNormal = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    labelInit = labelNormal;
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelNormal, this->m_func);
    instrInsert->InsertBefore(instrBranch);

    // Insert the labels

    instrInsert->InsertBefore(labelUndef);
    instrInsert->InsertBefore(labelNormal);

    //Adjustment for deadstore of ArgIn_A
    Js::ArgSlot highestSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
    Js::ArgSlot missingSlotNums = this->m_func->GetInParamsCount() - highestSlotNum;
    Assert(missingSlotNums >= 0);
    while (missingSlotNums > 0)
    {
        InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
        Lowerer::InsertBranch(Js::OpCode::BrEq_A, labelNormal, labelNormal);
        missingSlotNums--;
    }

    // MOV undefReg, undefAddress
    IR::Opnd* opndUndefAddress = this->LoadLibraryValueOpnd(labelNormal, LibraryValue::ValueUndefined);
    opndUndef =  IR::RegOpnd::New(TyMachPtr, this->m_func);
    Lowerer::InsertMove(opndUndef, opndUndefAddress, labelNormal);

    BVSparse<JitArenaAllocator> *formalsBv = JitAnew(this->m_alloc, BVSparse<JitArenaAllocator>, this->m_alloc);

    while (currArgInCount > 0)
    {
        dstOpnd = instrArgIn->GetDst();

        Assert(dstOpnd->IsRegOpnd());
        isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

        // Now insert the undef initialization before the "normal" label

        //     sn = assign undef

        Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

        //     INC excessOpnd
        //     BrEq_A $Ln-1

        currArgInCount--;

        labelInitNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

        // And insert the "normal" initialization before the "done" label

        //     sn = assign paramn
        // $Ln-1:

        labelInit->InsertAfter(labelInitNext);
        labelInit = labelInitNext;

        instrArgInNext = instrArgIn->m_prev;
        instrArgIn->Unlink();

        Js::ArgSlot prevParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

        //      function foo(x, x)  { use(x); }
        // This should refer to the second 'x'.  Since we reverse the order here however, we need to skip
        // the initialization of the first 'x' to not override the one for the second.  WOOB:1105504
        if (isDuplicate)
        {
            instrArgIn->Free();
        }
        else
        {
            ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
            labelInit->InsertBefore(instrArgIn);
            this->m_lowererMD.ChangeToAssign(instrArgIn);
        }
        instrArgIn = instrArgInNext;

        while (instrArgIn->m_opcode != Js::OpCode::ArgIn_A)
        {
            instrArgIn = instrArgIn->m_prev;
            AssertMsg(instrArgIn, "???");
        }

        //Adjustment for deadstore of ArgIn_A
        Js::ArgSlot currParamSlotNum = instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();
        Js::ArgSlot diffSlotsNum = prevParamSlotNum - currParamSlotNum;

        AssertMsg(diffSlotsNum > 0, "Argins are not in order?");

        while (diffSlotsNum > 0)
        {
            InsertAdd(true, excessOpnd, excessOpnd, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), labelNormal);
            InsertBranch(Js::OpCode::BrEq_A, labelInitNext, labelNormal);
            diffSlotsNum--;
        }

        AssertMsg(instrArgIn->GetSrc1()->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum() <= formalsCount,
                  "Expect all ArgIn's to be in numerical order by param slot");
    }

    // Insert final undef and normal initializations, jumping unconditionally to the end
    // rather than checking against the decremented formals count as we did inside the loop above.

    //     s2 = assign undef

    dstOpnd = instrArgIn->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    isDuplicate = formalsBv->TestAndSet(dstOpnd->AsRegOpnd()->m_sym->AsStackSym()->m_id);

    Lowerer::InsertMove(dstOpnd, opndUndef, labelNormal);

    if (hasRest)
    {
        InsertMove(excessOpnd, IR::IntConstOpnd::New(0, TyUint8, this->m_func), labelNormal);
    }

    //     Br $done

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instrBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    labelNormal->InsertBefore(instrBranch);

    //     s2 = assign param2
    // $done:

    labelInit->InsertAfter(labelDone);

    if (hasRest)
    {
        // The formals count has been tainted, so restore it before lowering rest
        IR::IntConstOpnd * formalsOpnd = IR::IntConstOpnd::New(this->m_func->GetInParamsCount(), TyUint32, this->m_func);
        LowerRestParameter(formalsOpnd, restDst, excessOpnd, labelDone, generatorArgsPtrOpnd);
    }

    instrArgIn->Unlink();
    if (isDuplicate)
    {
        instrArgIn->Free();
    }
    else
    {
        ConvertArgOpndIfGeneratorFunction(instrArgIn, generatorArgsPtrOpnd);
        labelDone->InsertBefore(instrArgIn);
        this->m_lowererMD.ChangeToAssign(instrArgIn);
    }

    JitAdelete(this->m_alloc, formalsBv);

    return instrResume;
}